

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BEREncode.cpp
# Opt level: O3

int __thiscall NullType::serialise(NullType *this,uint8_t *buf,size_t max_len)

{
  int iVar1;
  
  iVar1 = -0x1f;
  if (1 < max_len) {
    *buf = (char)(this->super_BER_CONTAINER)._type;
    buf[1] = '\0';
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

int NullType::serialise(uint8_t* buf, size_t max_len){
    return BER_CONTAINER::serialise(buf, max_len, 0);
}